

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextCursor>::copyAppend
          (QGenericArrayOps<QTextCursor> *this,QTextCursor *b,QTextCursor *e)

{
  qsizetype *pqVar1;
  QTextCursor *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QTextCursor>).ptr;
    for (; b < e; b = b + 1) {
      QTextCursor::QTextCursor(pQVar2 + (this->super_QArrayDataPointer<QTextCursor>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QTextCursor>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }